

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regfileparser.cpp
# Opt level: O3

string * GetValueSpecFromSetSpec(string *__return_storage_ptr__,string *spec,size_t start)

{
  char cVar1;
  char cVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  pcVar3 = (spec->_M_dataplus)._M_p;
  cVar1 = pcVar3[start];
  if (((cVar1 == '\'') || (cVar1 == '\"')) && (start + 1 < spec->_M_string_length)) {
    bVar5 = false;
    uVar4 = start + 2;
    do {
      if (bVar5) {
        bVar5 = false;
      }
      else {
        cVar2 = pcVar3[uVar4 - 1];
        if (cVar2 == cVar1) break;
        bVar5 = cVar2 == '\\';
      }
      bVar6 = uVar4 != spec->_M_string_length;
      uVar4 = uVar4 + 1;
    } while (bVar6);
  }
  std::__cxx11::string::find((char)spec,0x3d);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)spec);
  return __return_storage_ptr__;
}

Assistant:

std::string GetValueSpecFromSetSpec(const std::string& spec, size_t start)
{
    if (spec[start]=='\'' || spec[start]=='\"')
    {
        size_t endquote= findendquote(spec, start+1, spec[start]);
        //debug("GetValueSpecFromSetSpec:%s\n", spec.substr(endquote).c_str());

        //todo: check for missing quote.
        size_t eqpos= spec.find('=', endquote);
        return spec.substr(eqpos+1);
    }
    size_t eqpos= spec.find('=');

    //debug("GetValueSpecFromSetSpec:%s\n", spec.substr(eqpos+1).c_str());
    return spec.substr(eqpos+1);
}